

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<ImGuiWindow_*>::push_front(ImVector<ImGuiWindow_*> *this,ImGuiWindow **v)

{
  int iVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = this->Size;
  if (iVar1 == 0) {
    if (this->Capacity == 0) {
      ppIVar3 = (ImGuiWindow **)ImGui::MemAlloc(0x40);
      if (this->Data != (ImGuiWindow **)0x0) {
        memcpy(ppIVar3,this->Data,(long)this->Size << 3);
        ImGui::MemFree(this->Data);
      }
      this->Data = ppIVar3;
      this->Capacity = 8;
    }
    ppIVar3 = this->Data + this->Size;
  }
  else {
    iVar2 = this->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      iVar5 = iVar1 + 1;
      if (iVar1 + 1 < iVar4) {
        iVar5 = iVar4;
      }
      if (iVar2 < iVar5) {
        ppIVar3 = (ImGuiWindow **)ImGui::MemAlloc((long)iVar5 << 3);
        if (this->Data != (ImGuiWindow **)0x0) {
          memcpy(ppIVar3,this->Data,(long)this->Size << 3);
          ImGui::MemFree(this->Data);
        }
        this->Data = ppIVar3;
        this->Capacity = iVar5;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size << 3);
    }
    ppIVar3 = this->Data;
  }
  *ppIVar3 = *v;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }